

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.h
# Opt level: O1

Simplex * __thiscall
Gudhi::skeleton_blocker::
Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
::simplex(Simplex *__return_storage_ptr__,
         Trie<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
         *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(__return_storage_ptr__->simplex_set)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  add_vertices_up_to_the_root(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Simplex simplex() const {
    Simplex res;
    add_vertices_up_to_the_root(res);
    return res;
  }